

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rmlLinkedList.c
# Opt level: O2

void rmlLinkedListDestroy(void *self)

{
  while (*(long *)((long)self + 0x10) != 0) {
    rmlLinkedListPop(self);
  }
  free(self);
  return;
}

Assistant:

void rmlLinkedListDestroy(void *self) {
    struct rmlLinkedList *m = self;

    while (rmlLinkedListGetLength(self)) {
        rmlLinkedListPop(self);
    }

    rmlLinkedListReset(self);
    RML_VERBOSE("Destroy LinkedList(0x%llx)", (uint64_t) m)
    free(m);
}